

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int seek_file(WFile *f,uint64_t offset,int whence)

{
  int iVar1;
  __off_t _Var2;
  
  iVar1 = -1;
  if ((uint)whence < 3) {
    _Var2 = lseek(f->fd,offset,whence);
    iVar1 = (int)(_Var2 >> 0x3f);
  }
  return iVar1;
}

Assistant:

int seek_file(WFile *f, uint64_t offset, int whence)
{
    int lseek_whence;

    switch (whence) {
    case FROM_START:
        lseek_whence = SEEK_SET;
        break;
    case FROM_CURRENT:
        lseek_whence = SEEK_CUR;
        break;
    case FROM_END:
        lseek_whence = SEEK_END;
        break;
    default:
        return -1;
    }

    return lseek(f->fd, offset, lseek_whence) >= 0 ? 0 : -1;
}